

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Namespace.h
# Opt level: O1

Namespace * __thiscall
luabridge::Namespace::addFunction<bool,char_const*,unsigned_short>
          (Namespace *this,char *name,_func_bool_char_ptr_unsigned_short *fp)

{
  lua_State *L;
  int iVar1;
  
  iVar1 = lua_type((this->super_Registrar).L,-1);
  if (iVar1 != 5) {
    __assert_fail("lua_istable(L, -1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/LuaBridge/Source/LuaBridge/detail/Namespace.h"
                  ,0x507,
                  "Namespace &luabridge::Namespace::addFunction(const char *, ReturnType (*)(Params...)) [ReturnType = bool, Params = <const char *, unsigned short>]"
                 );
  }
  lua_pushlightuserdata((this->super_Registrar).L,fp);
  lua_pushcclosure((this->super_Registrar).L,
                   detail::CFunc::Call<bool_(*)(const_char_*,_unsigned_short)>::f,1);
  L = (this->super_Registrar).L;
  iVar1 = lua_type(L,-2);
  if (iVar1 == 5) {
    iVar1 = lua_absindex(L,-2);
    lua_pushstring(L,name);
    lua_rotate(L,-2,1);
    lua_rawset(L,iVar1);
    return this;
  }
  __assert_fail("lua_istable(L, index)",
                "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/LuaBridge/Source/LuaBridge/detail/LuaHelpers.h"
                ,100,"void luabridge::rawsetfield(lua_State *, int, const char *)");
}

Assistant:

Namespace& addFunction(char const* name, ReturnType (*fp)(Params...))
    {
        assert(lua_istable(L, -1)); // Stack: namespace table (ns)

        using FnType = decltype(fp);
        lua_pushlightuserdata(L, reinterpret_cast<void*>(fp)); // Stack: ns, function ptr
        lua_pushcclosure(L, &CFunc::Call<FnType>::f, 1); // Stack: ns, function
        rawsetfield(L, -2, name); // Stack: ns

        return *this;
    }